

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OsOpenMalloc(sqlite3_vfs *pVfs,char *zFile,sqlite3_file **ppFile,int flags,int *pOutFlags
                       )

{
  int iVar1;
  void *pvVar2;
  undefined4 in_ECX;
  char *in_RDX;
  sqlite3_vfs *in_RSI;
  undefined8 in_R8;
  sqlite3_file *pFile;
  int rc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((ulong)in_R8 >> 0x20);
  uVar3 = 0xaaaaaaaa;
  pvVar2 = sqlite3MallocZero(CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0));
  if (pvVar2 == (void *)0x0) {
    in_RDX[0] = '\0';
    in_RDX[1] = '\0';
    in_RDX[2] = '\0';
    in_RDX[3] = '\0';
    in_RDX[4] = '\0';
    in_RDX[5] = '\0';
    in_RDX[6] = '\0';
    in_RDX[7] = '\0';
    iVar1 = 7;
  }
  else {
    iVar1 = sqlite3OsOpen(in_RSI,in_RDX,(sqlite3_file *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                          iVar1,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffd0));
    if (iVar1 == 0) {
      *(void **)in_RDX = pvVar2;
    }
    else {
      sqlite3_free((void *)0x17274b);
      in_RDX[0] = '\0';
      in_RDX[1] = '\0';
      in_RDX[2] = '\0';
      in_RDX[3] = '\0';
      in_RDX[4] = '\0';
      in_RDX[5] = '\0';
      in_RDX[6] = '\0';
      in_RDX[7] = '\0';
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsOpenMalloc(
  sqlite3_vfs *pVfs,
  const char *zFile,
  sqlite3_file **ppFile,
  int flags,
  int *pOutFlags
){
  int rc;
  sqlite3_file *pFile;
  pFile = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if( pFile ){
    rc = sqlite3OsOpen(pVfs, zFile, pFile, flags, pOutFlags);
    if( rc!=SQLITE_OK ){
      sqlite3_free(pFile);
      *ppFile = 0;
    }else{
      *ppFile = pFile;
    }
  }else{
    *ppFile = 0;
    rc = SQLITE_NOMEM_BKPT;
  }
  assert( *ppFile!=0 || rc!=SQLITE_OK );
  return rc;
}